

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

void __thiscall CMU462::Matrix4x4::operator+=(Matrix4x4 *this,Matrix4x4 *B)

{
  double *Aij;
  
  this->entries[0].x = B->entries[0].x + this->entries[0].x;
  this->entries[0].y = B->entries[0].y + this->entries[0].y;
  this->entries[0].z = B->entries[0].z + this->entries[0].z;
  this->entries[0].w = B->entries[0].w + this->entries[0].w;
  this->entries[1].x = B->entries[1].x + this->entries[1].x;
  this->entries[1].y = B->entries[1].y + this->entries[1].y;
  this->entries[1].z = B->entries[1].z + this->entries[1].z;
  this->entries[1].w = B->entries[1].w + this->entries[1].w;
  this->entries[2].x = B->entries[2].x + this->entries[2].x;
  this->entries[2].y = B->entries[2].y + this->entries[2].y;
  this->entries[2].z = B->entries[2].z + this->entries[2].z;
  this->entries[2].w = B->entries[2].w + this->entries[2].w;
  this->entries[3].x = B->entries[3].x + this->entries[3].x;
  this->entries[3].y = B->entries[3].y + this->entries[3].y;
  this->entries[3].z = B->entries[3].z + this->entries[3].z;
  this->entries[3].w = B->entries[3].w + this->entries[3].w;
  return;
}

Assistant:

void Matrix4x4::operator+=( const Matrix4x4& B ) {

    Matrix4x4& A( *this );
    double* Aij = (double*) &A;
    const double* Bij = (const double*) &B;

	// Add the 16 contigous vector packed double values.
    *Aij++ += *Bij++;//0
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//4
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//8
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//12
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//15
	//16.

  }